

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall
Analyser_externalVariableByName_Test::~Analyser_externalVariableByName_Test
          (Analyser_externalVariableByName_Test *this)

{
  Analyser_externalVariableByName_Test *this_local;
  
  ~Analyser_externalVariableByName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Analyser, externalVariableByName)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    EXPECT_EQ(nullptr, analyser->externalVariable(model, "membrane", "V"));

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    analyser->addExternalVariable(externalVariable);

    EXPECT_EQ(externalVariable, analyser->externalVariable(model, "membrane", "V"));
    EXPECT_EQ(nullptr, analyser->externalVariable(model, "membrane", "X"));
}